

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3TransferBindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  int local_2c;
  int i;
  Vdbe *pTo;
  Vdbe *pFrom;
  sqlite3_stmt *pToStmt_local;
  sqlite3_stmt *pFromStmt_local;
  
  sqlite3_mutex_enter(*(sqlite3_mutex **)(*(long *)pToStmt + 0x18));
  for (local_2c = 0; local_2c < *(short *)(pFromStmt + 0x88); local_2c = local_2c + 1) {
    sqlite3VdbeMemMove((Mem *)(*(long *)(pToStmt + 0x78) + (long)local_2c * 0x38),
                       (Mem *)(*(long *)(pFromStmt + 0x78) + (long)local_2c * 0x38));
  }
  sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pToStmt + 0x18));
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3TransferBindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  int i;
  assert( pTo->db==pFrom->db );
  assert( pTo->nVar==pFrom->nVar );
  sqlite3_mutex_enter(pTo->db->mutex);
  for(i=0; i<pFrom->nVar; i++){
    sqlite3VdbeMemMove(&pTo->aVar[i], &pFrom->aVar[i]);
  }
  sqlite3_mutex_leave(pTo->db->mutex);
  return SQLITE_OK;
}